

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O2

void __thiscall
duckdb::Connection::
CreateAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<int>,int,int>
          (Connection *this,string *name)

{
  type pCVar1;
  string *in_RDX;
  AggregateFunction function;
  LogicalType aLStack_288 [24];
  AggregateFunction local_270;
  AggregateFunction local_140;
  
  UDFWrapper::
  CreateUnaryAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<int>,int,int>
            (&local_140,(UDFWrapper *)name,in_RDX);
  AggregateFunction::AggregateFunction(&local_270,&local_140);
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)this);
  duckdb::LogicalType::LogicalType(aLStack_288,INVALID);
  duckdb::UDFWrapper::RegisterAggrFunction(&local_270,pCVar1,aLStack_288);
  duckdb::LogicalType::~LogicalType(aLStack_288);
  AggregateFunction::~AggregateFunction(&local_270);
  AggregateFunction::~AggregateFunction(&local_140);
  return;
}

Assistant:

void CreateAggregateFunction(const string &name) {
		AggregateFunction function = UDFWrapper::CreateAggregateFunction<UDF_OP, STATE, TR, TA>(name);
		UDFWrapper::RegisterAggrFunction(function, *context);
	}